

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void sat_solver_analyze(sat_solver *s,int h,veci *learnt)

{
  lit *plVar1;
  int *piVar2;
  int iVar3;
  lit lVar4;
  int iVar5;
  int iVar6;
  clause *c_00;
  lit *plVar7;
  int *piVar8;
  int local_68;
  lit tmp;
  int max;
  int max_i;
  int lev;
  int x_1;
  clause *c;
  int x;
  int minl;
  int j;
  int i;
  lit *lits;
  int local_30;
  int ind;
  lit p;
  int cnt;
  lit *trail;
  veci *learnt_local;
  int h_local;
  sat_solver *s_local;
  
  plVar1 = s->trail;
  ind = 0;
  local_30 = -2;
  iVar3 = s->qtail;
  veci_push(learnt,-2);
  lits._4_4_ = iVar3 + -1;
  learnt_local._4_4_ = h;
  do {
    if (learnt_local._4_4_ == 0) {
      __assert_fail("h != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.c"
                    ,0x313,"void sat_solver_analyze(sat_solver *, int, veci *)");
    }
    iVar3 = clause_is_lit(learnt_local._4_4_);
    if (iVar3 == 0) {
      c_00 = clause_read(s,learnt_local._4_4_);
      iVar3 = clause_learnt(c_00);
      if (iVar3 != 0) {
        act_clause_bump(s,c_00);
      }
      plVar7 = clause_begin(c_00);
      for (x = (int)(local_30 != -2); iVar5 = clause_size(c_00), iVar3 = lits._4_4_, x < iVar5;
          x = x + 1) {
        iVar3 = lit_var(plVar7[x]);
        iVar5 = var_tag(s,iVar3);
        if ((iVar5 == 0) && (iVar5 = var_level(s,iVar3), 0 < iVar5)) {
          var_set_tag(s,iVar3,1);
          act_var_bump(s,iVar3);
          iVar3 = var_level(s,iVar3);
          iVar5 = sat_solver_dl(s);
          if (iVar3 == iVar5) {
            ind = ind + 1;
          }
          else {
            veci_push(learnt,plVar7[x]);
          }
        }
      }
    }
    else {
      lVar4 = clause_read_lit(learnt_local._4_4_);
      iVar5 = lit_var(lVar4);
      iVar6 = var_tag(s,iVar5);
      iVar3 = lits._4_4_;
      if ((iVar6 == 0) && (iVar6 = var_level(s,iVar5), 0 < iVar6)) {
        var_set_tag(s,iVar5,1);
        act_var_bump(s,iVar5);
        iVar3 = var_level(s,iVar5);
        iVar5 = sat_solver_dl(s);
        if (iVar3 == iVar5) {
          ind = ind + 1;
          iVar3 = lits._4_4_;
        }
        else {
          lVar4 = clause_read_lit(learnt_local._4_4_);
          veci_push(learnt,lVar4);
          iVar3 = lits._4_4_;
        }
      }
    }
    do {
      lits._4_4_ = iVar3;
      iVar3 = lit_var(plVar1[lits._4_4_]);
      iVar5 = var_tag(s,iVar3);
      iVar3 = lits._4_4_ + -1;
    } while (iVar5 == 0);
    local_30 = plVar1[lits._4_4_];
    piVar8 = s->reasons;
    iVar3 = lit_var(local_30);
    learnt_local._4_4_ = piVar8[iVar3];
    ind = ind + -1;
    lits._4_4_ = lits._4_4_ + -1;
  } while (0 < ind);
  lVar4 = lit_neg(local_30);
  piVar8 = veci_begin(learnt);
  *piVar8 = lVar4;
  piVar8 = veci_begin(learnt);
  c._4_4_ = 0;
  for (minl = 1; iVar3 = veci_size(learnt), minl < iVar3; minl = minl + 1) {
    iVar3 = lit_var(piVar8[minl]);
    iVar3 = var_level(s,iVar3);
    c._4_4_ = 1 << ((byte)iVar3 & 0x1f) | c._4_4_;
  }
  x = 1;
  minl = 1;
  do {
    iVar3 = veci_size(learnt);
    if (iVar3 <= minl) {
      veci_resize(learnt,x);
      (s->stats).tot_literals = (long)x + (s->stats).tot_literals;
      solver2_clear_tags(s,0);
      iVar3 = veci_size(learnt);
      if (1 < iVar3) {
        tmp = 1;
        iVar3 = lit_var(piVar8[1]);
        local_68 = var_level(s,iVar3);
        for (minl = 2; iVar3 = veci_size(learnt), minl < iVar3; minl = minl + 1) {
          iVar3 = lit_var(piVar8[minl]);
          iVar3 = var_level(s,iVar3);
          if (local_68 < iVar3) {
            iVar3 = lit_var(piVar8[minl]);
            local_68 = var_level(s,iVar3);
            tmp = minl;
          }
        }
        iVar3 = piVar8[1];
        piVar8[1] = piVar8[tmp];
        piVar8[tmp] = iVar3;
      }
      return;
    }
    piVar2 = s->reasons;
    iVar3 = lit_var(piVar8[minl]);
    if (piVar2[iVar3] == 0) {
LAB_00630d5a:
      piVar8[x] = piVar8[minl];
      x = x + 1;
    }
    else {
      iVar3 = lit_var(piVar8[minl]);
      iVar3 = sat_solver_lit_removable(s,iVar3,c._4_4_);
      if (iVar3 == 0) goto LAB_00630d5a;
    }
    minl = minl + 1;
  } while( true );
}

Assistant:

static void sat_solver_analyze(sat_solver* s, int h, veci* learnt)
{
    lit*     trail   = s->trail;
    int      cnt     = 0;
    lit      p       = lit_Undef;
    int      ind     = s->qtail-1;
    lit*     lits;
    int      i, j, minl;
    veci_push(learnt,lit_Undef);
    do{
        assert(h != 0);
        if (clause_is_lit(h)){
            int x = lit_var(clause_read_lit(h));
            if (var_tag(s, x) == 0 && var_level(s, x) > 0){
                var_set_tag(s, x, 1);
                act_var_bump(s,x);
                if (var_level(s, x) == sat_solver_dl(s))
                    cnt++;
                else
                    veci_push(learnt,clause_read_lit(h));
            }
        }else{
            clause* c = clause_read(s, h);
            if (clause_learnt(c))
                act_clause_bump(s,c);
            lits = clause_begin(c);
            //printlits(lits,lits+clause_size(c)); printf("\n");
            for (j = (p == lit_Undef ? 0 : 1); j < clause_size(c); j++){
                int x = lit_var(lits[j]);
                if (var_tag(s, x) == 0 && var_level(s, x) > 0){
                    var_set_tag(s, x, 1);
                    act_var_bump(s,x);
                    // bump variables propaged by the LBD=2 clause
//                    if ( s->reasons[x] && clause_read(s, s->reasons[x])->lbd <= 2 )
//                        act_var_bump(s,x);
                    if (var_level(s,x) == sat_solver_dl(s))
                        cnt++;
                    else
                        veci_push(learnt,lits[j]);
                }
            }
        }

        while ( !var_tag(s, lit_var(trail[ind--])) );

        p = trail[ind+1];
        h = s->reasons[lit_var(p)];
        cnt--;

    }while (cnt > 0);

    *veci_begin(learnt) = lit_neg(p);

    lits = veci_begin(learnt);
    minl = 0;
    for (i = 1; i < veci_size(learnt); i++){
        int lev = var_level(s, lit_var(lits[i]));
        minl    |= 1 << (lev & 31);
    }

    // simplify (full)
    for (i = j = 1; i < veci_size(learnt); i++){
        if (s->reasons[lit_var(lits[i])] == 0 || !sat_solver_lit_removable(s,lit_var(lits[i]),minl))
            lits[j++] = lits[i];
    }

    // update size of learnt + statistics
    veci_resize(learnt,j);
    s->stats.tot_literals += j;


    // clear tags
    solver2_clear_tags(s,0);

#ifdef DEBUG
    for (i = 0; i < s->size; i++)
        assert(!var_tag(s, i));
#endif

#ifdef VERBOSEDEBUG
    printf(L_IND"Learnt {", L_ind);
    for (i = 0; i < veci_size(learnt); i++) printf(" "L_LIT, L_lit(lits[i]));
#endif
    if (veci_size(learnt) > 1){
        int max_i = 1;
        int max   = var_level(s, lit_var(lits[1]));
        lit tmp;

        for (i = 2; i < veci_size(learnt); i++)
            if (var_level(s, lit_var(lits[i])) > max){
                max   = var_level(s, lit_var(lits[i]));
                max_i = i;
            }

        tmp         = lits[1];
        lits[1]     = lits[max_i];
        lits[max_i] = tmp;
    }
#ifdef VERBOSEDEBUG
    {
        int lev = veci_size(learnt) > 1 ? var_level(s, lit_var(lits[1])) : 0;
        printf(" } at level %d\n", lev);
    }
#endif
}